

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariable.cpp
# Opt level: O0

void __thiscall
rsg::Variable::tokenizeDeclaration(Variable *this,GeneratorState *state,TokenStream *str)

{
  bool bVar1;
  Type TVar2;
  ProgramParameters *pPVar3;
  TokenStream *pTVar4;
  Shader *pSVar5;
  char *identifier;
  Token local_1f8;
  Token local_1e8;
  Token local_1d8;
  Token local_1c8;
  Token local_1b8;
  Token local_1a8;
  Token local_198;
  Token local_188;
  Token local_178;
  Token local_168;
  Token local_158;
  Token local_148;
  Token local_138;
  Token local_128;
  Token local_118;
  Token local_108;
  Token local_f8;
  Token local_e8;
  Token local_d8;
  Token local_c8;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  Token local_68;
  Token local_58 [2];
  Token local_38;
  Version local_24;
  TokenStream *pTStack_20;
  Version targetVersion;
  TokenStream *str_local;
  GeneratorState *state_local;
  Variable *this_local;
  
  pTStack_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  pPVar3 = GeneratorState::getProgramParameters(state);
  pTVar4 = pTStack_20;
  local_24 = pPVar3->version;
  switch(this->m_storage) {
  case STORAGE_LOCAL:
    break;
  case STORAGE_SHADER_IN:
    if ((int)local_24 < 1) {
      pSVar5 = GeneratorState::getShader((GeneratorState *)str_local);
      TVar2 = rsg::Shader::getType(pSVar5);
      pTVar4 = pTStack_20;
      if (TVar2 == TYPE_VERTEX) {
        Token::Token(&local_128,ATTRIBUTE);
        TokenStream::operator<<(pTVar4,&local_128);
        Token::~Token(&local_128);
      }
      else if (TVar2 == TYPE_FRAGMENT) {
        Token::Token(&local_138,VARYING);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_138);
        Token::Token(&local_148,MEDIUM_PRECISION);
        TokenStream::operator<<(pTVar4,&local_148);
        Token::~Token(&local_148);
        Token::~Token(&local_138);
      }
    }
    else {
      bVar1 = hasLayoutLocation(this);
      pTVar4 = pTStack_20;
      if (bVar1) {
        Token::Token(&local_a8,LAYOUT);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_a8);
        Token::Token(&local_b8,LEFT_PAREN);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_b8);
        Token::Token(&local_c8,LOCATION);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_c8);
        Token::Token(&local_d8,EQUAL);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_d8);
        Token::Token(&local_e8,this->m_layoutLocation);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_e8);
        Token::Token(&local_f8,RIGHT_PAREN);
        TokenStream::operator<<(pTVar4,&local_f8);
        Token::~Token(&local_f8);
        Token::~Token(&local_e8);
        Token::~Token(&local_d8);
        Token::~Token(&local_c8);
        Token::~Token(&local_b8);
        Token::~Token(&local_a8);
      }
      pTVar4 = pTStack_20;
      Token::Token(&local_108,IN);
      TokenStream::operator<<(pTVar4,&local_108);
      Token::~Token(&local_108);
      pSVar5 = GeneratorState::getShader((GeneratorState *)str_local);
      TVar2 = rsg::Shader::getType(pSVar5);
      pTVar4 = pTStack_20;
      if (TVar2 == TYPE_FRAGMENT) {
        Token::Token(&local_118,MEDIUM_PRECISION);
        TokenStream::operator<<(pTVar4,&local_118);
        Token::~Token(&local_118);
      }
    }
    break;
  case STORAGE_SHADER_OUT:
    if ((int)local_24 < 1) {
      pSVar5 = GeneratorState::getShader((GeneratorState *)str_local);
      TVar2 = rsg::Shader::getType(pSVar5);
      pTVar4 = pTStack_20;
      if (TVar2 == TYPE_VERTEX) {
        Token::Token(&local_1d8,VARYING);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_1d8);
        Token::Token(&local_1e8,MEDIUM_PRECISION);
        TokenStream::operator<<(pTVar4,&local_1e8);
        Token::~Token(&local_1e8);
        Token::~Token(&local_1d8);
      }
    }
    else {
      bVar1 = hasLayoutLocation(this);
      pTVar4 = pTStack_20;
      if (bVar1) {
        Token::Token(&local_158,LAYOUT);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_158);
        Token::Token(&local_168,LEFT_PAREN);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_168);
        Token::Token(&local_178,LOCATION);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_178);
        Token::Token(&local_188,EQUAL);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_188);
        Token::Token(&local_198,this->m_layoutLocation);
        pTVar4 = TokenStream::operator<<(pTVar4,&local_198);
        Token::Token(&local_1a8,RIGHT_PAREN);
        TokenStream::operator<<(pTVar4,&local_1a8);
        Token::~Token(&local_1a8);
        Token::~Token(&local_198);
        Token::~Token(&local_188);
        Token::~Token(&local_178);
        Token::~Token(&local_168);
        Token::~Token(&local_158);
      }
      pTVar4 = pTStack_20;
      Token::Token(&local_1b8,OUT);
      pTVar4 = TokenStream::operator<<(pTVar4,&local_1b8);
      Token::Token(&local_1c8,MEDIUM_PRECISION);
      TokenStream::operator<<(pTVar4,&local_1c8);
      Token::~Token(&local_1c8);
      Token::~Token(&local_1b8);
    }
    break;
  case STORAGE_UNIFORM:
    Token::Token(&local_88,UNIFORM);
    TokenStream::operator<<(pTVar4,&local_88);
    Token::~Token(&local_88);
    bVar1 = VariableType::isFloatOrVec(&this->m_type);
    if ((bVar1) || (bVar1 = VariableType::isIntOrVec(&this->m_type), bVar1)) {
      pTVar4 = pTStack_20;
      Token::Token(&local_98,MEDIUM_PRECISION);
      TokenStream::operator<<(pTVar4,&local_98);
      Token::~Token(&local_98);
    }
    break;
  case STORAGE_CONST:
    Token::Token(&local_38,CONST);
    TokenStream::operator<<(pTVar4,&local_38);
    Token::~Token(&local_38);
    break;
  case STORAGE_PARAMETER_IN:
    Token::Token(local_58,IN);
    TokenStream::operator<<(pTVar4,local_58);
    Token::~Token(local_58);
    break;
  case STORAGE_PARAMETER_OUT:
    Token::Token(&local_68,OUT);
    TokenStream::operator<<(pTVar4,&local_68);
    Token::~Token(&local_68);
    break;
  case STORAGE_PARAMETER_INOUT:
    Token::Token(&local_78,INOUT);
    TokenStream::operator<<(pTVar4,&local_78);
    Token::~Token(&local_78);
  }
  VariableType::tokenizeShortType(&this->m_type,pTStack_20);
  pTVar4 = pTStack_20;
  identifier = (char *)std::__cxx11::string::c_str();
  Token::Token(&local_1f8,identifier);
  TokenStream::operator<<(pTVar4,&local_1f8);
  Token::~Token(&local_1f8);
  return;
}

Assistant:

void Variable::tokenizeDeclaration (GeneratorState& state, TokenStream& str) const
{
	Version targetVersion = state.getProgramParameters().version;

	// \todo [2011-03-10 pyry] Remove precision hacks once precision handling is implemented
	switch (m_storage)
	{
		case STORAGE_CONST:				str << Token::CONST;		break;
		case STORAGE_PARAMETER_IN:		str << Token::IN;			break;
		case STORAGE_PARAMETER_OUT:		str << Token::OUT;			break;
		case STORAGE_PARAMETER_INOUT:	str << Token::INOUT;		break;

		case STORAGE_UNIFORM:
		{
			str << Token::UNIFORM;
			if (m_type.isFloatOrVec() || m_type.isIntOrVec())
				str << Token::MEDIUM_PRECISION;
			break;
		}

		case STORAGE_SHADER_IN:
		{
			if (targetVersion >= VERSION_300)
			{
				if (hasLayoutLocation())
					str << Token::LAYOUT << Token::LEFT_PAREN << Token::LOCATION << Token::EQUAL << m_layoutLocation << Token::RIGHT_PAREN;

				str << Token::IN;

				if (state.getShader().getType() == Shader::TYPE_FRAGMENT)
					str << Token::MEDIUM_PRECISION;
			}
			else
			{
				DE_ASSERT(!hasLayoutLocation());

				switch (state.getShader().getType())
				{
					case Shader::TYPE_VERTEX:	str << Token::ATTRIBUTE;								break;
					case Shader::TYPE_FRAGMENT:	str << Token::VARYING << Token::MEDIUM_PRECISION;		break;
					default:					DE_ASSERT(DE_FALSE);									break;
				}
			}
			break;
		}

		case STORAGE_SHADER_OUT:
		{
			if (targetVersion >= VERSION_300)
			{
				if (hasLayoutLocation())
					str << Token::LAYOUT << Token::LEFT_PAREN << Token::LOCATION << Token::EQUAL << m_layoutLocation << Token::RIGHT_PAREN;

				str << Token::OUT << Token::MEDIUM_PRECISION;
			}
			else
			{
				DE_ASSERT(!hasLayoutLocation());

				if (state.getShader().getType() == Shader::TYPE_VERTEX)
					str << Token::VARYING << Token::MEDIUM_PRECISION;
				else
					DE_ASSERT(DE_FALSE);
			}
			break;
		}

		case STORAGE_LOCAL:
		default:
			/* nothing */
			break;
	}

	m_type.tokenizeShortType(str);

	DE_ASSERT(m_name != "");
	str << Token(m_name.c_str());
}